

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,InlineCacheIndex inlineCacheIndex,bool isRootLoad)

{
  RealCount *pRVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type pSVar6;
  long lVar7;
  bool bVar8;
  undefined1 local_39;
  short local_38;
  undefined2 local_36;
  undefined1 auStack_34 [3];
  OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') &&
       (local_38 = (short)returnValueRegister, (int)local_38 == returnValueRegister)) &&
      (local_36 = (undefined2)functionRegister, functionRegister < 0x10000)) &&
     (local_39 = (undefined1)givenArgCount, givenArgCount < 0x100)) {
    _auStack_34 = inlineCacheIndex;
    uVar4 = Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_39,9);
    bVar8 = true;
    if (isRootLoad) {
      lVar7 = 3 - (ulong)(op < InvalidOpCode);
      if (lVar7 + (ulong)uVar4 + 9 != (ulong)(this->m_byteCodeData).currentOffset) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x490,
                                    "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>))"
                                    ,
                                    "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>)"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pSVar6 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(this->m_labelOffsets->
                                     super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>
                                     ).alloc,0x364470);
      pSVar6[1].next = (Type)(lVar7 + (ulong)uVar4 + 5);
      pSVar6->next = (this->rootObjectLoadMethodInlineCacheOffsets).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this->rootObjectLoadMethodInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.
      next = pSVar6;
      pRVar1 = &(this->rootObjectLoadMethodInlineCacheOffsets).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIWithICIndex(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, InlineCacheIndex inlineCacheIndex, bool isRootLoad)
    {
        OpLayoutT_CallIWithICIndex<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.inlineCacheIndex, inlineCacheIndex))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            if (isRootLoad)
            {
                Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIWithICIndex<SizePolicy>));
                size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                    + offsetof(OpLayoutT_CallIWithICIndex<SizePolicy>, inlineCacheIndex);

                rootObjectLoadMethodInlineCacheOffsets.Prepend(m_labelOffsets->GetAllocator(), inlineCacheOffset);
            }
            return true;
        }
        return false;
    }